

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O0

bool __thiscall Assimp::STLImporter::LoadBinaryFile(STLImporter *this)

{
  ushort uVar1;
  float fVar2;
  undefined8 uVar3;
  aiNode *paVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uchar *puVar8;
  aiMesh **ppaVar9;
  aiMesh *this_00;
  DeadlyImportError *pDVar10;
  Logger *pLVar11;
  ulong uVar12;
  aiColor4t<float> *paVar13;
  aiColor4D *paVar14;
  aiNode *this_01;
  ulong uVar15;
  aiNode **ppaVar16;
  uint *puVar17;
  uchar *puVar18;
  byte *pbVar19;
  aiColor4t<float> *local_1c8;
  aiVector3t<float> *local_1a0;
  aiVector3t<float> *local_178;
  uint local_11c;
  uint i_2;
  aiNode *node;
  aiNode *root;
  ai_real invVal;
  aiColor4D *clr;
  uint i_1;
  undefined1 auStack_ec [2];
  uint16_t color;
  uint i;
  aiVector3F theVec3F;
  aiVector3F *theVec;
  aiVector3D *vn;
  aiVector3D *vp;
  string local_c0;
  undefined1 local_9a;
  allocator<char> local_99;
  string local_98;
  uint *local_78;
  uchar *sz;
  uchar *puStack_68;
  ai_real invByte;
  uchar *szEnd;
  uchar *sz2;
  bool bIsMaterialise;
  allocator<char> local_41;
  string local_40;
  aiMesh *local_20;
  aiMesh *pMesh;
  STLImporter *this_local;
  
  this->pScene->mNumMeshes = 1;
  pMesh = (aiMesh *)this;
  ppaVar9 = (aiMesh **)operator_new__(8);
  this->pScene->mMeshes = ppaVar9;
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  *this->pScene->mMeshes = this_00;
  this_00->mMaterialIndex = 0;
  local_20 = this_00;
  if (this->fileSize < 0x54) {
    sz2._3_1_ = 1;
    pDVar10 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"STL: file is too small for the header",&local_41);
    DeadlyImportError::DeadlyImportError(pDVar10,&local_40);
    sz2._3_1_ = 0;
    __cxa_throw(pDVar10,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  sz2._2_1_ = 0;
  puStack_68 = (uchar *)(this->mBuffer + 0x50);
  puVar8 = (uchar *)this->mBuffer;
  do {
    szEnd = puVar8;
    if (puStack_68 <= szEnd) goto LAB_00a6b5c5;
    puVar8 = szEnd + 1;
  } while (((((*szEnd != 'C') || (puVar8 = szEnd + 2, szEnd[1] != 'O')) ||
            (puVar8 = szEnd + 3, szEnd[2] != 'L')) ||
           ((puVar8 = szEnd + 4, szEnd[3] != 'O' ||
            (puVar18 = szEnd + 5, puVar8 = puVar18, szEnd[4] != 'R')))) ||
          (szEnd = szEnd + 6, puVar8 = szEnd, *puVar18 != '='));
  sz2._2_1_ = 1;
  pLVar11 = DefaultLogger::get();
  Logger::info(pLVar11,"STL: Taking code path for Materialise files");
  sz._4_4_ = 0x3b808081;
  (this->clrColorDefault).r = (float)*szEnd * 0.003921569;
  (this->clrColorDefault).g = (float)szEnd[1] * 0.003921569;
  pbVar19 = szEnd + 3;
  (this->clrColorDefault).b = (float)szEnd[2] * 0.003921569;
  szEnd = szEnd + 4;
  (this->clrColorDefault).a = (float)*pbVar19 * 0.003921569;
LAB_00a6b5c5:
  local_78 = (uint *)(this->mBuffer + 0x50);
  aiString::Set(&this->pScene->mRootNode->mName,"<STL_BINARY>");
  local_20->mNumFaces = *local_78;
  local_78 = local_78 + 1;
  if (this->fileSize < local_20->mNumFaces * 0x32 + 0x54) {
    local_9a = 1;
    pDVar10 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"STL: file is too small to hold all facets",&local_99);
    DeadlyImportError::DeadlyImportError(pDVar10,&local_98);
    local_9a = 0;
    __cxa_throw(pDVar10,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (local_20->mNumFaces != 0) {
    local_20->mNumVertices = local_20->mNumFaces * 3;
    uVar15 = CONCAT44(0,local_20->mNumVertices);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar15;
    uVar12 = SUB168(auVar5 * ZEXT816(0xc),0);
    if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    vn = (aiVector3D *)operator_new__(uVar12);
    if (uVar15 != 0) {
      local_178 = vn;
      do {
        aiVector3t<float>::aiVector3t(local_178);
        local_178 = local_178 + 1;
      } while (local_178 != vn + uVar15);
    }
    local_20->mVertices = vn;
    uVar15 = CONCAT44(0,local_20->mNumVertices);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar15;
    uVar12 = SUB168(auVar6 * ZEXT816(0xc),0);
    if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    theVec = (aiVector3F *)operator_new__(uVar12);
    if (uVar15 != 0) {
      local_1a0 = theVec;
      do {
        aiVector3t<float>::aiVector3t(local_1a0);
        local_1a0 = local_1a0 + 1;
      } while (local_1a0 != theVec + uVar15);
    }
    local_20->mNormals = theVec;
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)auStack_ec);
    for (i_1 = 0; i_1 < local_20->mNumFaces; i_1 = i_1 + 1) {
      uVar3 = *(undefined8 *)local_78;
      fVar2 = (float)local_78[2];
      _auStack_ec = (float)uVar3;
      theVec->x = _auStack_ec;
      i = (uint)((ulong)uVar3 >> 0x20);
      theVec->y = (float)i;
      theVec->z = fVar2;
      fVar2 = theVec->y;
      theVec[1].x = theVec->x;
      theVec[1].y = fVar2;
      theVec[1].z = theVec->z;
      fVar2 = theVec->y;
      theVec[2].x = theVec->x;
      theVec[2].y = fVar2;
      theVec[2].z = theVec->z;
      theVec = theVec + 3;
      uVar3 = *(undefined8 *)(local_78 + 3);
      fVar2 = (float)local_78[5];
      _auStack_ec = (float)uVar3;
      vn->x = _auStack_ec;
      i = (uint)((ulong)uVar3 >> 0x20);
      vn->y = (float)i;
      vn->z = fVar2;
      uVar3 = *(undefined8 *)(local_78 + 6);
      fVar2 = (float)local_78[8];
      _auStack_ec = (float)uVar3;
      vn[1].x = _auStack_ec;
      i = (uint)((ulong)uVar3 >> 0x20);
      vn[1].y = (float)i;
      vn[1].z = fVar2;
      _auStack_ec = (float)local_78[9];
      i = local_78[10];
      theVec3F.x = (float)local_78[0xb];
      vn[2].x = _auStack_ec;
      vn[2].y = (float)i;
      vn[2].z = theVec3F.x;
      theVec3F._4_8_ = local_78 + 0xc;
      vn = vn + 3;
      uVar1 = (ushort)*(uint *)theVec3F._4_8_;
      local_78 = (uint *)((long)local_78 + 0x32);
      if ((uVar1 & 0x8000) != 0) {
        if (local_20->mColors[0] == (aiColor4D *)0x0) {
          uVar15 = CONCAT44(0,local_20->mNumVertices);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar15;
          uVar12 = SUB168(auVar7 * ZEXT816(0x10),0);
          if (SUB168(auVar7 * ZEXT816(0x10),8) != 0) {
            uVar12 = 0xffffffffffffffff;
          }
          paVar13 = (aiColor4t<float> *)operator_new__(uVar12);
          if (uVar15 != 0) {
            local_1c8 = paVar13;
            do {
              aiColor4t<float>::aiColor4t(local_1c8);
              local_1c8 = local_1c8 + 1;
            } while (local_1c8 != paVar13 + uVar15);
          }
          local_20->mColors[0] = paVar13;
          for (clr._0_4_ = 0; (uint)clr < local_20->mNumVertices; clr._0_4_ = (uint)clr + 1) {
            paVar14 = local_20->mColors[0];
            local_20->mColors[0] = paVar14 + 1;
            fVar2 = (this->clrColorDefault).g;
            paVar14->r = (this->clrColorDefault).r;
            paVar14->g = fVar2;
            fVar2 = (this->clrColorDefault).a;
            paVar14->b = (this->clrColorDefault).b;
            paVar14->a = fVar2;
          }
          local_20->mColors[0] = local_20->mColors[0] + -(ulong)local_20->mNumVertices;
          pLVar11 = DefaultLogger::get();
          Logger::info(pLVar11,"STL: Mesh has vertex colors");
        }
        paVar14 = local_20->mColors[0] + i_1 * 3;
        paVar14->a = 1.0;
        if ((sz2._2_1_ & 1) == 0) {
          paVar14->b = (float)(uVar1 & 0x31) * 0.032258064;
          paVar14->g = (float)(uVar1 >> 5 & 0x31) * 0.032258064;
          paVar14->r = (float)(uVar1 >> 10 & 0xfff1) * 0.032258064;
        }
        else {
          paVar14->r = (float)(uVar1 & 0x31) * 0.032258064;
          paVar14->g = (float)(uVar1 >> 5 & 0x31) * 0.032258064;
          paVar14->b = (float)(uVar1 >> 10 & 0xfff1) * 0.032258064;
        }
        fVar2 = paVar14->g;
        paVar14[1].r = paVar14->r;
        paVar14[1].g = fVar2;
        fVar2 = paVar14->a;
        paVar14[1].b = paVar14->b;
        paVar14[1].a = fVar2;
        fVar2 = paVar14->g;
        paVar14[2].r = paVar14->r;
        paVar14[2].g = fVar2;
        fVar2 = paVar14->a;
        paVar14[2].b = paVar14->b;
        paVar14[2].a = fVar2;
      }
    }
    addFacesToMesh(local_20);
    paVar4 = this->pScene->mRootNode;
    this_01 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_01);
    this_01->mParent = paVar4;
    paVar4->mNumChildren = 1;
    auVar5 = ZEXT416(paVar4->mNumChildren) * ZEXT816(8);
    uVar15 = auVar5._0_8_;
    if (auVar5._8_8_ != 0) {
      uVar15 = 0xffffffffffffffff;
    }
    ppaVar16 = (aiNode **)operator_new__(uVar15);
    paVar4->mChildren = ppaVar16;
    *paVar4->mChildren = this_01;
    this_01->mNumMeshes = this->pScene->mNumMeshes;
    auVar5 = ZEXT416(this->pScene->mNumMeshes) * ZEXT816(4);
    uVar15 = auVar5._0_8_;
    if (auVar5._8_8_ != 0) {
      uVar15 = 0xffffffffffffffff;
    }
    puVar17 = (uint *)operator_new__(uVar15);
    this_01->mMeshes = puVar17;
    for (local_11c = 0; local_11c < this->pScene->mNumMeshes; local_11c = local_11c + 1) {
      this_01->mMeshes[local_11c] = local_11c;
    }
    if (((sz2._2_1_ & 1) == 0) || (local_20->mColors[0] != (aiColor4D *)0x0)) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
    return this_local._7_1_;
  }
  vp._6_1_ = 1;
  pDVar10 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"STL: file is empty. There are no facets defined",
             (allocator<char> *)((long)&vp + 7));
  DeadlyImportError::DeadlyImportError(pDVar10,&local_c0);
  vp._6_1_ = 0;
  __cxa_throw(pDVar10,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

bool STLImporter::LoadBinaryFile()
{
    // allocate one mesh
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];
    aiMesh* pMesh = pScene->mMeshes[0] = new aiMesh();
    pMesh->mMaterialIndex = 0;

    // skip the first 80 bytes
    if (fileSize < 84) {
        throw DeadlyImportError("STL: file is too small for the header");
    }
    bool bIsMaterialise = false;

    // search for an occurrence of "COLOR=" in the header
    const unsigned char* sz2 = (const unsigned char*)mBuffer;
    const unsigned char* const szEnd = sz2+80;
    while (sz2 < szEnd) {

        if ('C' == *sz2++ && 'O' == *sz2++ && 'L' == *sz2++ &&
            'O' == *sz2++ && 'R' == *sz2++ && '=' == *sz2++)    {

            // read the default vertex color for facets
            bIsMaterialise = true;
            ASSIMP_LOG_INFO("STL: Taking code path for Materialise files");
            const ai_real invByte = (ai_real)1.0 / ( ai_real )255.0;
            clrColorDefault.r = (*sz2++) * invByte;
            clrColorDefault.g = (*sz2++) * invByte;
            clrColorDefault.b = (*sz2++) * invByte;
            clrColorDefault.a = (*sz2++) * invByte;
            break;
        }
    }
    const unsigned char* sz = (const unsigned char*)mBuffer + 80;

    // now read the number of facets
    pScene->mRootNode->mName.Set("<STL_BINARY>");

    pMesh->mNumFaces = *((uint32_t*)sz);
    sz += 4;

    if (fileSize < 84 + pMesh->mNumFaces*50) {
        throw DeadlyImportError("STL: file is too small to hold all facets");
    }

    if (!pMesh->mNumFaces) {
        throw DeadlyImportError("STL: file is empty. There are no facets defined");
    }

    pMesh->mNumVertices = pMesh->mNumFaces*3;

    
    aiVector3D *vp = pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
    aiVector3D *vn = pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];

    typedef aiVector3t<float> aiVector3F;
    aiVector3F* theVec;
    aiVector3F theVec3F;
    
    for ( unsigned int i = 0; i < pMesh->mNumFaces; ++i ) {
        // NOTE: Blender sometimes writes empty normals ... this is not
        // our fault ... the RemoveInvalidData helper step should fix that

        // There's one normal for the face in the STL; use it three times
        // for vertex normals
        theVec = (aiVector3F*) sz;
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vn->x = theVec3F.x; vn->y = theVec3F.y; vn->z = theVec3F.z;
        *(vn+1) = *vn;
        *(vn+2) = *vn;
        ++theVec;
        vn += 3;

        // vertex 1
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vp->x = theVec3F.x; vp->y = theVec3F.y; vp->z = theVec3F.z;
        ++theVec;
        ++vp;

        // vertex 2
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vp->x = theVec3F.x; vp->y = theVec3F.y; vp->z = theVec3F.z;
        ++theVec;
        ++vp;

        // vertex 3
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vp->x = theVec3F.x; vp->y = theVec3F.y; vp->z = theVec3F.z;
        ++theVec;
        ++vp;
        
        sz = (const unsigned char*) theVec;

        uint16_t color = *((uint16_t*)sz);
        sz += 2;

        if (color & (1 << 15))
        {
            // seems we need to take the color
            if (!pMesh->mColors[0])
            {
                pMesh->mColors[0] = new aiColor4D[pMesh->mNumVertices];
                for (unsigned int i = 0; i <pMesh->mNumVertices;++i)
                    *pMesh->mColors[0]++ = this->clrColorDefault;
                pMesh->mColors[0] -= pMesh->mNumVertices;

                ASSIMP_LOG_INFO("STL: Mesh has vertex colors");
            }
            aiColor4D* clr = &pMesh->mColors[0][i*3];
            clr->a = 1.0;
            const ai_real invVal( (ai_real)1.0 / ( ai_real )31.0 );
            if (bIsMaterialise) // this is reversed
            {
                clr->r = (color & 0x31u) *invVal;
                clr->g = ((color & (0x31u<<5))>>5u) *invVal;
                clr->b = ((color & (0x31u<<10))>>10u) *invVal;
            }
            else
            {
                clr->b = (color & 0x31u) *invVal;
                clr->g = ((color & (0x31u<<5))>>5u) *invVal;
                clr->r = ((color & (0x31u<<10))>>10u) *invVal;
            }
            // assign the color to all vertices of the face
            *(clr+1) = *clr;
            *(clr+2) = *clr;
        }
    }

    // now copy faces
    addFacesToMesh(pMesh);

    aiNode* root = pScene->mRootNode;

    // allocate one node
    aiNode* node = new aiNode();
    node->mParent = root;

    root->mNumChildren = 1u;
    root->mChildren = new aiNode*[root->mNumChildren];
    root->mChildren[0] = node;

    // add all created meshes to the single node
    node->mNumMeshes = pScene->mNumMeshes;
    node->mMeshes = new unsigned int[pScene->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes; i++)
        node->mMeshes[i] = i;

    if (bIsMaterialise && !pMesh->mColors[0])
    {
        // use the color as diffuse material color
        return true;
    }
    return false;
}